

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  ModuleHeaderSyntax *args_2;
  SyntaxList<slang::syntax::MemberSyntax> *args_3;
  ModuleDeclarationSyntax *pMVar1;
  Token local_40;
  NamedBlockClauseSyntax *local_30;
  
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                      (BumpAllocator *)__child_stack);
  args_2 = (ModuleHeaderSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0x58),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xa0) == (SyntaxNode *)0x0) {
    local_30 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_30 = (NamedBlockClauseSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  }
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,args_1,args_2,args_3,
                      &local_40,&local_30);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModuleDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModuleDeclarationSyntax>(
        node.kind,
        *deepClone(node.attributes, alloc),
        *deepClone<ModuleHeaderSyntax>(*node.header, alloc),
        *deepClone(node.members, alloc),
        node.endmodule.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr
    );
}